

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

int Dashel::getOrCreateSocket(ParameterSet *target)

{
  int iVar1;
  DashelException *pDVar2;
  int *piVar3;
  string *name;
  char *line;
  string local_60;
  undefined1 local_3c [8];
  sockaddr_in addr;
  IPV4Address remoteAddress;
  int local_14;
  int fd;
  ParameterSet *target_local;
  
  local_14 = ParameterSet::get<int>(target,"sock");
  if (local_14 < 0) {
    local_14 = socket(2,1,6);
    if (local_14 < 0) {
      pDVar2 = (DashelException *)__cxa_allocate_exception(0x20);
      piVar3 = __errno_location();
      DashelException::DashelException
                (pDVar2,ConnectionFailed,*piVar3,"Cannot create socket.",(Stream *)0x0);
      __cxa_throw(pDVar2,&DashelException::typeinfo,DashelException::~DashelException);
    }
    name = ParameterSet::get_abi_cxx11_(target,"host");
    iVar1 = ParameterSet::get<int>(target,"port");
    IPV4Address::IPV4Address((IPV4Address *)addr.sin_zero,name,(unsigned_short)iVar1);
    local_3c._0_2_ = 2;
    local_3c._2_2_ = htons(addr.sin_zero._4_2_);
    local_3c._4_4_ = htonl(addr.sin_zero._0_4_);
    iVar1 = connect(local_14,(sockaddr *)local_3c,0x10);
    if (iVar1 != 0) {
      pDVar2 = (DashelException *)__cxa_allocate_exception(0x20);
      piVar3 = __errno_location();
      DashelException::DashelException
                (pDVar2,ConnectionFailed,*piVar3,"Cannot connect to remote host.",(Stream *)0x0);
      __cxa_throw(pDVar2,&DashelException::typeinfo,DashelException::~DashelException);
    }
    IPV4Address::format_abi_cxx11_(&local_60,(IPV4Address *)addr.sin_zero,true);
    line = (char *)std::__cxx11::string::c_str();
    ParameterSet::add(target,line);
    std::__cxx11::string::~string((string *)&local_60);
    ParameterSet::erase(target,"connectionPort");
  }
  return local_14;
}

Assistant:

static int getOrCreateSocket(ParameterSet& target)
	{
		int fd = target.get<int>("sock");
		if (fd < 0)
		{
			// create socket
			fd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
			if (fd < 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot create socket.");

			IPV4Address remoteAddress(target.get("host"), target.get<int>("port"));

			// connect
			sockaddr_in addr;
			addr.sin_family = AF_INET;
			addr.sin_port = htons(remoteAddress.port);
			addr.sin_addr.s_addr = htonl(remoteAddress.address);
			if (connect(fd, (struct sockaddr*)&addr, sizeof(addr)) != 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot connect to remote host.");

			// overwrite target name with a canonical one
			target.add(remoteAddress.format().c_str());
			target.erase("connectionPort");
		}
		return fd;
	}